

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

char * __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::type_name(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *this)

{
  if ((ulong)this->m_type < 9) {
    return &DAT_0047e9a4 + *(int *)(&DAT_0047e9a4 + (ulong)this->m_type * 4);
  }
  return "number";
}

Assistant:

const char* type_name() const noexcept {
		{
			switch (m_type) {
				case value_t::null:
					return "null";
				case value_t::object:
					return "object";
				case value_t::array:
					return "array";
				case value_t::string:
					return "string";
				case value_t::boolean:
					return "boolean";
				case value_t::discarded:
					return "discarded";
				default:
					return "number";
			}
		}
	}